

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int iVar1;
  int iReg;
  Expr *pEVar2;
  int *in_RDX;
  Expr *in_RSI;
  Parse *in_RDI;
  int r1;
  int r2;
  int in_stack_000001ac;
  Expr *in_stack_000001b0;
  Parse *in_stack_000001b8;
  Expr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  uVar3 = 0xaaaaaaaa;
  pEVar2 = sqlite3ExprSkipCollateAndLikely(in_RSI);
  if ((((in_RDI->okConstFactor == '\0') || (pEVar2 == (Expr *)0x0)) || (pEVar2->op == 0xb0)) ||
     (iVar1 = sqlite3ExprIsConstantNotJoin
                        ((Parse *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8), iVar1 == 0)) {
    iReg = sqlite3GetTempReg(in_RDI);
    iVar1 = sqlite3ExprCodeTarget(in_stack_000001b8,in_stack_000001b0,in_stack_000001ac);
    if (iVar1 == iReg) {
      *in_RDX = iReg;
    }
    else {
      sqlite3ReleaseTempReg(in_RDI,iReg);
      *in_RDX = 0;
    }
  }
  else {
    *in_RDX = 0;
    iVar1 = sqlite3ExprCodeRunJustOnce((Parse *)pExpr,(Expr *)pReg,r2);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( ConstFactorOk(pParse)
   && ALWAYS(pExpr!=0)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pParse, pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeRunJustOnce(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}